

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O3

PyObject * pybind11_object_new(PyTypeObject *type,PyObject *param_2,PyObject *param_3)

{
  instance *this;
  
  this = (instance *)(*type->tp_alloc)(type,0);
  pybind11::detail::instance::allocate_layout(this);
  this->field_0x30 = this->field_0x30 | 1;
  return &this->ob_base;
}

Assistant:

inline PyObject *make_new_instance(PyTypeObject *type) {
#if defined(PYPY_VERSION)
    // PyPy gets tp_basicsize wrong (issue 2482) under multiple inheritance when the first inherited
    // object is a a plain Python type (i.e. not derived from an extension type).  Fix it.
    ssize_t instance_size = static_cast<ssize_t>(sizeof(instance));
    if (type->tp_basicsize < instance_size) {
        type->tp_basicsize = instance_size;
    }
#endif
    PyObject *self = type->tp_alloc(type, 0);
    auto inst = reinterpret_cast<instance *>(self);
    // Allocate the value/holder internals:
    inst->allocate_layout();

    inst->owned = true;

    return self;
}